

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.c
# Opt level: O2

void paint(ATimeUs timestamp,float dt)

{
  undefined4 *puVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  AMat4f model4;
  AMat4f vp4;
  undefined8 local_158;
  float afStack_150 [4];
  undefined1 local_140 [16];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  float local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  AVec4f local_e8;
  AVec4f local_d8;
  AVec4f local_c8;
  AVec4f local_b8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  AGLClearParams local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  fVar6 = (float)timestamp * 1e-06;
  fVar4 = sinf(fVar6 * 0.1);
  fVar5 = sinf(fVar6 * 0.2);
  local_60.g = fVar5 * 0.3;
  local_60.r = fVar4 * 0.3;
  local_60.b = sinf(fVar6 * 0.3);
  local_60.b = local_60.b * 0.3;
  local_60.a = 1.0;
  local_60.depth = 1.0;
  local_60.bits = AGLCB_ColorAndDepth;
  aGLClear(&local_60,&g.target);
  fVar4 = sinf(fVar6 * 0.37);
  fVar4 = fVar4 * 0.7;
  fVar5 = 1.0 / SQRT(fVar4 * fVar4 + 0.040000003 + 0.48999998);
  local_f8 = ZEXT416((uint)fVar5);
  local_108 = ZEXT416((uint)(fVar5 * 0.7));
  fVar5 = fVar6 * -0.4 * 0.5;
  local_118 = cosf(fVar5);
  fVar5 = sinf(fVar5);
  fVar6 = (float)local_108._0_4_ * fVar5;
  fVar4 = fVar5 * fVar4 * (float)local_f8._0_4_;
  fVar5 = fVar5 * (float)local_f8._0_4_ * 0.2;
  fVar9 = fVar5 * fVar5 + fVar6 * fVar6;
  fVar11 = fVar4 * fVar5 + local_118 * fVar6;
  fVar12 = fVar4 * fVar6 - fVar5 * local_118;
  fVar10 = fVar4 * fVar5 - local_118 * fVar6;
  fVar8 = fVar6 * fVar6 + fVar4 * fVar4;
  fVar7 = fVar5 * fVar6 + local_118 * fVar4;
  fVar13 = fVar6 * fVar4 + local_118 * fVar5;
  fVar6 = fVar6 * fVar5 + -local_118 * fVar4;
  fVar4 = fVar4 * fVar4 + fVar5 * fVar5;
  local_a0._4_4_ = fVar11 + fVar11;
  local_a0._0_4_ = 1.0 - (fVar9 + fVar9);
  local_a0._8_4_ = fVar12 + fVar12;
  local_a0._12_4_ = 0;
  local_90._4_4_ = 1.0 - (fVar8 + fVar8);
  local_90._0_4_ = fVar10 + fVar10;
  local_90._8_4_ = fVar7 + fVar7;
  local_90._12_4_ = 0;
  local_80._4_4_ = fVar6 + fVar6;
  local_80._0_4_ = fVar13 + fVar13;
  local_80._8_4_ = 1.0 - (fVar4 + fVar4);
  local_80._12_4_ = 0;
  local_70 = 0;
  uStack_6c = 0;
  uStack_68 = 0;
  uStack_64 = 0x3f800000;
  local_140 = ZEXT416(0);
  local_158 = SUB168(ZEXT416(0x3f800000),0);
  afStack_150[0] = 0.0;
  afStack_150[1] = 0.0;
  afStack_150[2] = 0.0;
  afStack_150[3] = 1.0;
  local_130 = SUB168(ZEXT416(0x3f800000),0);
  uStack_128 = 0;
  local_120 = 0x3f800000c1200000;
  local_e8 = g.projection.X;
  local_d8 = g.projection.Y;
  local_c8 = g.projection.Z;
  local_b8 = g.projection.W;
  puVar1 = &aMat4fMul_m;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fVar4 = (&local_e8.x)[lVar2];
    fVar5 = (&local_d8.x)[lVar2];
    fVar6 = (&local_c8.x)[lVar2];
    fVar7 = (&local_b8.x)[lVar2];
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
      *(float *)((long)puVar1 + lVar3) =
           *(float *)((long)afStack_150 + lVar3 + 4) * fVar7 +
           *(float *)((long)afStack_150 + lVar3) * fVar6 +
           *(float *)((long)&local_158 + lVar3) * fVar4 +
           *(float *)((long)&local_158 + lVar3 + 4) * fVar5;
    }
    puVar1 = puVar1 + 1;
  }
  g.pun[0].value.pf = (GLfloat *)&local_48;
  local_18 = _DAT_00109ba8;
  uStack_10 = uRam0000000000109bb0;
  local_28 = _DAT_00109b98;
  uStack_20 = uRam0000000000109ba0;
  local_38 = _DAT_00109b88;
  uStack_30 = uRam0000000000109b90;
  local_48 = _aMat4fMul_m;
  uStack_40 = uRam0000000000109b80;
  g.pun[1].value.pf = (GLfloat *)local_a0;
  aGLDraw(&g.draw,&g.merge,&g.target);
  return;
}

Assistant:

static void paint(ATimeUs timestamp, float dt) {
	float t = timestamp * 1e-6f;
	AGLClearParams clear;
	(void)(dt);

	clear.a = 1;
	clear.r = .3f * sinf(t * .1f);
	clear.g = .3f * sinf(t * .2f);
	clear.b = .3f * sinf(t * .3f);
	clear.depth = 1;
	clear.bits = AGLCB_Everything;

	aGLClear(&clear, &g.target);

	struct AReFrame frame;
	frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(.7f * sinf(t * .37f), .2f, .7f)), -t * .4f);
	frame.transl = aVec3f(0, 0, 0);

	struct AMat4f model4 = aMat4fReFrame(frame), vp4 = aMat4fMul(g.projection, aMat4fTranslation(aVec3f(0, 0, -10)));
	g.pun[1].value.pf = &model4.X.x;
	g.pun[0].value.pf = &vp4.X.x;

	aGLDraw(&g.draw, &g.merge, &g.target);
}